

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void cl_reset_writer(Curl_easy *data)

{
  Curl_cwriter *local_18;
  Curl_cwriter *writer;
  Curl_easy *data_local;
  
  local_18 = (data->req).writer_stack;
  while (local_18 != (Curl_cwriter *)0x0) {
    (data->req).writer_stack = local_18->next;
    (*local_18->cwt->do_close)(data,local_18);
    (*Curl_cfree)(local_18);
    local_18 = (data->req).writer_stack;
  }
  return;
}

Assistant:

static void cl_reset_writer(struct Curl_easy *data)
{
  struct Curl_cwriter *writer = data->req.writer_stack;
  while(writer) {
    data->req.writer_stack = writer->next;
    writer->cwt->do_close(data, writer);
    free(writer);
    writer = data->req.writer_stack;
  }
}